

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libperfetto-connector.cpp
# Opt level: O0

void KokkosTools::PerfettoConnector::kokkosp_begin_parallel_for
               (char *name,uint32_t dev_id,uint64_t *param_3)

{
  atomic<unsigned_char> *paVar1;
  uint64_t *param_4_local;
  char *pcStack_70;
  uint32_t dev_id_local;
  char *name_local;
  anon_class_16_2_38ee1b33 *local_60;
  undefined8 local_58;
  anon_class_16_2_38ee1b33 local_50;
  undefined8 local_40;
  uint local_34;
  undefined8 uStack_30;
  uint32_t instances;
  anon_class_8_1_dda845c3 local_28;
  byte local_19;
  memory_order local_18;
  int local_14;
  memory_order __b;
  
  param_4_local._4_4_ = dev_id;
  pcStack_70 = name;
  perfetto::internal::anon_unknown_15::ValidateEventNameType<perfetto::StaticString>();
  local_50.name = &stack0xffffffffffffff90;
  local_50.dev_id = (uint32_t *)((long)&param_4_local + 4);
  local_58 = 0;
  local_60 = &local_50;
  name_local = (char *)0x0;
  uStack_30 = 0;
  local_40 = 0;
  local_28.callback = local_60;
  paVar1 = perfetto::internal::
           TrackEventDataSource<perfetto::TrackEvent,_&perfetto::internal::kCategoryRegistry>::
           CategoryTracePointTraits::GetActiveInstances((TracePointData)0x0);
  local_14 = 0;
  ___b = paVar1;
  local_18 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_14 - 1U < 2) {
    local_19 = (paVar1->super___atomic_base<unsigned_char>)._M_i;
  }
  else if (local_14 == 5) {
    local_19 = (paVar1->super___atomic_base<unsigned_char>)._M_i;
  }
  else {
    local_19 = (paVar1->super___atomic_base<unsigned_char>)._M_i;
  }
  local_34 = (uint)local_19;
  if (local_34 != 0) {
    perfetto::internal::
    TrackEventDataSource<perfetto::TrackEvent,_&perfetto::internal::kCategoryRegistry>::
    CallIfCategoryEnabled<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/libperfetto-connector.cpp:172:3)>
    ::anon_class_8_1_dda845c3::operator()(&local_28,local_34);
  }
  return;
}

Assistant:

void kokkosp_begin_parallel_for(const char *name, const uint32_t dev_id,
                                uint64_t *) {
  TRACE_EVENT_BEGIN("kokkos.parallel_for", perfetto::StaticString{name},
                    "device", dev_id);
}